

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

string * __thiscall
spvtools::spvResultToString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_result_t res)

{
  spv_result_t res_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((int)this) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_SUCCESS");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_UNSUPPORTED");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_END_OF_STREAM");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_WARNING");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_FAILED_MATCH");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_REQUESTED_TERMINATION");
    break;
  case -0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_LAYOUT");
    break;
  case -0xb:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_CFG");
    break;
  case -10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_ID");
    break;
  case -9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_LOOKUP");
    break;
  case -8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_DIAGNOSTIC")
    ;
    break;
  case -7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_VALUE");
    break;
  case -6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_TABLE");
    break;
  case -5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_TEXT");
    break;
  case -4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_BINARY");
    break;
  case -3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INVALID_POINTER");
    break;
  case -2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_OUT_OF_MEMORY");
    break;
  case -1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SPV_ERROR_INTERNAL");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Unknown Error");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string spvResultToString(spv_result_t res) {
  std::string out;
  switch (res) {
    case SPV_SUCCESS:
      out = "SPV_SUCCESS";
      break;
    case SPV_UNSUPPORTED:
      out = "SPV_UNSUPPORTED";
      break;
    case SPV_END_OF_STREAM:
      out = "SPV_END_OF_STREAM";
      break;
    case SPV_WARNING:
      out = "SPV_WARNING";
      break;
    case SPV_FAILED_MATCH:
      out = "SPV_FAILED_MATCH";
      break;
    case SPV_REQUESTED_TERMINATION:
      out = "SPV_REQUESTED_TERMINATION";
      break;
    case SPV_ERROR_INTERNAL:
      out = "SPV_ERROR_INTERNAL";
      break;
    case SPV_ERROR_OUT_OF_MEMORY:
      out = "SPV_ERROR_OUT_OF_MEMORY";
      break;
    case SPV_ERROR_INVALID_POINTER:
      out = "SPV_ERROR_INVALID_POINTER";
      break;
    case SPV_ERROR_INVALID_BINARY:
      out = "SPV_ERROR_INVALID_BINARY";
      break;
    case SPV_ERROR_INVALID_TEXT:
      out = "SPV_ERROR_INVALID_TEXT";
      break;
    case SPV_ERROR_INVALID_TABLE:
      out = "SPV_ERROR_INVALID_TABLE";
      break;
    case SPV_ERROR_INVALID_VALUE:
      out = "SPV_ERROR_INVALID_VALUE";
      break;
    case SPV_ERROR_INVALID_DIAGNOSTIC:
      out = "SPV_ERROR_INVALID_DIAGNOSTIC";
      break;
    case SPV_ERROR_INVALID_LOOKUP:
      out = "SPV_ERROR_INVALID_LOOKUP";
      break;
    case SPV_ERROR_INVALID_ID:
      out = "SPV_ERROR_INVALID_ID";
      break;
    case SPV_ERROR_INVALID_CFG:
      out = "SPV_ERROR_INVALID_CFG";
      break;
    case SPV_ERROR_INVALID_LAYOUT:
      out = "SPV_ERROR_INVALID_LAYOUT";
      break;
    default:
      out = "Unknown Error";
  }
  return out;
}